

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

string * __thiscall
t_swift_generator::function_signature_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_function *tfunction)

{
  t_struct *tstruct;
  t_type *ttype;
  int iVar1;
  allocator local_a1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  if (this->gen_cocoa_ == true) {
    function_name_abi_cxx11_(&local_a0,this,tfunction);
  }
  else {
    std::__cxx11::string::string((string *)&local_a0,(string *)&tfunction->name_);
  }
  std::operator+(__return_storage_ptr__,"func ",&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  tstruct = tfunction->arglist_;
  std::__cxx11::string::string((string *)&local_60,"",&local_a1);
  argument_list(&local_40,this,tstruct,&local_60,false);
  std::operator+(&local_80,"(",&local_40);
  std::operator+(&local_a0,&local_80,") throws");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  ttype = tfunction->returntype_;
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
  if ((char)iVar1 == '\0') {
    type_name_abi_cxx11_(&local_80,this,ttype,false,false);
    std::operator+(&local_a0," -> ",&local_80);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_swift_generator::function_signature(t_function* tfunction) {

  string result = "func " + (gen_cocoa_ ? function_name(tfunction) : tfunction->get_name());

  result += "(" + argument_list(tfunction->get_arglist(), "", false) + ") throws"; /// argsreview

  t_type* ttype = tfunction->get_returntype();
  if (!ttype->is_void()) {
    result += " -> " + type_name(ttype);
  }

  return result;
}